

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O2

uint fl_utf8to_mb(char *src,uint srclen,char *dst,uint dstlen)

{
  wchar_t wVar1;
  uint uVar2;
  wchar_t *dst_00;
  size_t sVar3;
  wchar_t lbuf [1024];
  wchar_t awStack_1038 [1026];
  
  dst_00 = awStack_1038;
  wVar1 = fl_utf8locale();
  if (wVar1 != L'\0') goto LAB_001a874a;
  uVar2 = fl_utf8towc(src,srclen,awStack_1038,0x400);
  if (0x3ff < uVar2) {
    dst_00 = (wchar_t *)malloc((ulong)(uVar2 + 1) * 4);
    fl_utf8towc(src,srclen,dst_00,uVar2 + 1);
  }
  if (dstlen == 0) {
LAB_001a87ca:
    sVar3 = wcstombs((char *)0x0,dst_00,0);
    uVar2 = (uint)sVar3;
  }
  else {
    sVar3 = wcstombs(dst,dst_00,(ulong)dstlen);
    uVar2 = (uint)sVar3;
    if ((int)(dstlen - 1) <= (int)uVar2) goto LAB_001a87ca;
  }
  if (dst_00 != awStack_1038) {
    free(dst_00);
  }
  if (-1 < (int)uVar2) {
    return uVar2;
  }
LAB_001a874a:
  if (srclen < dstlen) {
    memcpy(dst,src,(ulong)srclen);
    dst[srclen] = '\0';
  }
  return srclen;
}

Assistant:

unsigned fl_utf8to_mb(const char* src, unsigned srclen,
		  char* dst, unsigned dstlen)
{
  if (!fl_utf8locale()) {
#ifdef WIN32
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    unsigned length = fl_utf8towc(src, srclen, buf, 1024);
    unsigned ret;
    if (length >= 1024) {
      buf = (wchar_t*)(malloc((length+1)*sizeof(wchar_t)));
      fl_utf8towc(src, srclen, buf, length+1);
    }
    if (dstlen) {
      /* apparently this does not null-terminate, even though msdn
       * documentation claims it does:
       */
      ret =
        WideCharToMultiByte(GetACP(), 0, buf, length, dst, dstlen, 0, 0);
      dst[ret] = 0;
    }
    /* if it overflows or measuring length, get the actual length: */
    if (dstlen==0 || ret >= dstlen-1)
      ret =
	WideCharToMultiByte(GetACP(), 0, buf, length, 0, 0, 0, 0);
    if (buf != lbuf) free((void*)buf);
    return ret;
#else
    wchar_t lbuf[1024];
    wchar_t* buf = lbuf;
    unsigned length = fl_utf8towc(src, srclen, buf, 1024);
    int ret; /* note: wcstombs() returns unsigned(length) or unsigned(-1) */
    if (length >= 1024) {
      buf = (wchar_t*)(malloc((length+1)*sizeof(wchar_t)));
      fl_utf8towc(src, srclen, buf, length+1);
    }
    if (dstlen) {
      ret = wcstombs(dst, buf, dstlen);
      if (ret >= (int)dstlen-1) ret = wcstombs(0,buf,0);
    } else {
      ret = wcstombs(0,buf,0);
    }
    if (buf != lbuf) free((void*)buf);
    if (ret >= 0) return (unsigned)ret;
    /* on any errors we return the UTF-8 as raw text...*/
#endif
  }
  /* identity transform: */
  if (srclen < dstlen) {
    memcpy(dst, src, srclen);
    dst[srclen] = 0;
  } else {
    /* Buffer insufficent or buffer query */
  }
  return srclen;
}